

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O2

void __thiscall DSDcc::DSDDstar::DSDDstar(DSDDstar *this,DSDDecoder *dsdDecoder)

{
  EVP_PKEY_CTX *ctx;
  
  this->m_dsdDecoder = dsdDecoder;
  this->m_voiceFrameCount = 0;
  this->m_frameType = DStarVoiceFrame;
  this->m_symbolIndex = 0;
  this->m_symbolIndexHD = 0;
  Viterbi3::Viterbi3(&this->m_viterbi,2,(uint *)&Viterbi::Poly23a,false);
  DStarCRC::DStarCRC(&this->m_crcDStar);
  ctx = (EVP_PKEY_CTX *)0x8408;
  CRC::CRC(&this->m_crc,0x8408,0x10,0xffff,0xffff,1,0,0);
  this->slowdataIx = 0;
  this->w = (int *)0x0;
  this->x = (int *)0x0;
  DStarHeader::DStarHeader(&this->m_header);
  DPRS::DPRS(&this->m_dprs);
  reset_header_strings(this);
  DStarSlowData::init(&this->m_slowData,ctx);
  this->nullBytes[0] = '\0';
  this->nullBytes[1] = '\0';
  this->nullBytes[2] = '\0';
  this->nullBytes[3] = '\0';
  this->slowdata[0] = '\0';
  this->slowdata[1] = '\0';
  this->slowdata[2] = '\0';
  this->slowdata[3] = '\0';
  return;
}

Assistant:

DSDDstar::DSDDstar(DSDDecoder *dsdDecoder) :
		m_dsdDecoder(dsdDecoder),
		m_voiceFrameCount(0),
		m_frameType(DStarVoiceFrame),
		m_symbolIndex(0),
		m_symbolIndexHD(0),
        m_viterbi(2, Viterbi::Poly23a, false),
        m_crc(CRC::PolyDStar16, 16, 0xffff, 0xffff, 1, 0, 0),
		slowdataIx(0),
		w(0),
		x(0)
{
    reset_header_strings();
    m_slowData.init();
    memset(nullBytes, 0, 4);
    memset(slowdata, 0, 4);
}